

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::RenderPerformanceTestBase::init
          (RenderPerformanceTestBase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ShaderProgram *pSVar3;
  ProgramSources *pPVar4;
  TestError *pTVar5;
  allocator<char> local_192;
  allocator<char> local_191;
  undefined1 local_190 [40];
  string local_168;
  string local_148;
  undefined1 local_128 [40];
  ProgramSources local_100;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pSVar3 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_191);
  glu::VertexSource::VertexSource((VertexSource *)local_190,&local_148);
  pPVar4 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\nvoid main (void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,&local_192);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_128,&local_168);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_128);
  glu::ShaderProgram::ShaderProgram(pSVar3,renderCtx,pPVar4);
  this->m_renderProgram = pSVar3;
  std::__cxx11::string::~string((string *)(local_128 + 8));
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)(local_190 + 8));
  std::__cxx11::string::~string((string *)&local_148);
  glu::ProgramSources::~ProgramSources(&local_100);
  pSVar3 = this->m_renderProgram;
  if ((pSVar3->m_program).m_info.linkOk == false) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar3);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"could not build program",(allocator<char> *)local_190);
    tcu::TestError::TestError(pTVar5,(string *)&local_100);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x780))
                    ((pSVar3->m_program).m_program,"a_color");
  this->m_colorLoc = iVar2;
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x780))
                    ((this->m_renderProgram->m_program).m_program,"a_position");
  this->m_positionLoc = iVar1;
  if (this->m_colorLoc != -1) {
    if (iVar1 != -1) {
      return iVar1;
    }
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Location of attribute a_position was -1",
               (allocator<char> *)local_190);
    tcu::TestError::TestError(pTVar5,(string *)&local_100);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Location of attribute a_color was -1",
             (allocator<char> *)local_190);
  tcu::TestError::TestError(pTVar5,(string *)&local_100);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderPerformanceTestBase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_renderProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_colorVertexShader) << glu::FragmentSource(s_colorFragmentShader));
	if (!m_renderProgram->isOk())
	{
		m_testCtx.getLog() << *m_renderProgram;
		throw tcu::TestError("could not build program");
	}

	m_colorLoc = gl.getAttribLocation(m_renderProgram->getProgram(), "a_color");
	m_positionLoc = gl.getAttribLocation(m_renderProgram->getProgram(), "a_position");

	if (m_colorLoc == -1)
		throw tcu::TestError("Location of attribute a_color was -1");
	if (m_positionLoc == -1)
		throw tcu::TestError("Location of attribute a_position was -1");
}